

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

double __thiscall
fmt::v6::internal::grisu_shortest_handler::round(grisu_shortest_handler *this,double __x)

{
  ulong uVar1;
  int iVar2;
  ulong *in_RCX;
  undefined1 in_DL;
  undefined7 in_register_00000011;
  ulong in_RSI;
  long in_R8;
  bool bVar3;
  uint64_t error_local;
  uint64_t *remainder_local;
  uint64_t divisor_local;
  uint64_t d_local;
  grisu_shortest_handler *this_local;
  
  uVar1 = CONCAT71(in_register_00000011,in_DL);
  while( true ) {
    bVar3 = false;
    if (((*in_RCX < in_RSI) && (bVar3 = false, uVar1 <= in_R8 - *in_RCX)) &&
       (bVar3 = true, in_RSI <= *in_RCX + uVar1)) {
      bVar3 = (*in_RCX + uVar1) - in_RSI <= in_RSI - *in_RCX;
    }
    if (!bVar3) break;
    iVar2 = this->size + -1;
    this->buf[iVar2] = this->buf[iVar2] + -1;
    *in_RCX = uVar1 + *in_RCX;
  }
  return __x;
}

Assistant:

void round(uint64_t d, uint64_t divisor, uint64_t& remainder,
             uint64_t error) {
    while (
        remainder < d && error - remainder >= divisor &&
        (remainder + divisor < d || d - remainder >= remainder + divisor - d)) {
      --buf[size - 1];
      remainder += divisor;
    }
  }